

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSubscriptMat4x3(ShaderEvalContext *c)

{
  Vector<float,_3> local_b8;
  Vector<float,_3> local_a8;
  Vector<float,_3> local_98;
  tcu local_8c [12];
  tcu local_80 [12];
  Vector<float,_3> local_74;
  tcu local_68 [12];
  tcu local_5c [12];
  tcu local_50 [12];
  tcu local_44 [12];
  VecAccess<float,_4,_3> local_38;
  
  local_a8.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  local_74.m_data[0] = local_a8.m_data[1];
  local_74.m_data._4_8_ = *(undefined8 *)((c->coords).m_data + 2);
  local_a8.m_data[2] = local_74.m_data[1];
  tcu::operator*(local_68,0.5,&local_74);
  tcu::operator+(local_5c,&local_a8,(Vector<float,_3> *)local_68);
  local_b8.m_data[2] = (c->coords).m_data[0];
  local_b8.m_data._0_8_ = *(undefined8 *)((c->coords).m_data + 2);
  tcu::operator*(local_80,0.25,&local_b8);
  tcu::operator+(local_50,(Vector<float,_3> *)local_5c,(Vector<float,_3> *)local_80);
  local_98.m_data[0] = (c->coords).m_data[3];
  local_98.m_data._4_8_ = *(undefined8 *)(c->coords).m_data;
  tcu::operator*(local_8c,0.125,&local_98);
  tcu::operator+(local_44,(Vector<float,_3> *)local_50,(Vector<float,_3> *)local_8c);
  local_38.m_vector = &c->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_44);
  return;
}

Assistant:

void evalSubscriptMat4x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0) + 0.125f*c.coords.swizzle(3,0,1); }